

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O3

uint8_t * __thiscall
FastPForLib::VByte::decodeFromByteArray
          (VByte *this,uint8_t *inbyte,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  uint32_t *puVar3;
  size_t sVar4;
  byte *pbVar5;
  uint32_t uVar6;
  uint uVar7;
  
  if (length == 0) {
    sVar4 = 0;
  }
  else {
    pbVar2 = inbyte + length;
    puVar3 = out;
    if (5 < (long)length) {
      pbVar5 = inbyte + 5;
      do {
        uVar6 = *inbyte & 0x7f;
        if ((char)*inbyte < '\0') {
          uVar6 = uVar6 | (inbyte[1] & 0x7f) << 7;
          if ((char)inbyte[1] < '\0') {
            uVar6 = uVar6 | (inbyte[2] & 0x7f) << 0xe;
            if ((char)inbyte[2] < '\0') {
              pbVar1 = inbyte + 3;
              inbyte = inbyte + 4;
              uVar6 = uVar6 | (*pbVar1 & 0x7f) << 0x15;
              if ((char)*pbVar1 < '\0') {
                uVar6 = uVar6 | (uint)*inbyte << 0x1c;
                inbyte = pbVar5;
              }
            }
            else {
              inbyte = inbyte + 3;
            }
          }
          else {
            inbyte = inbyte + 2;
          }
        }
        else {
          inbyte = inbyte + 1;
        }
        *puVar3 = uVar6;
        puVar3 = puVar3 + 1;
        pbVar5 = inbyte + 5;
      } while (pbVar5 < pbVar2);
    }
    if (inbyte < pbVar2) {
      do {
        uVar6 = 0;
        uVar7 = 0;
        do {
          pbVar5 = inbyte;
          uVar6 = ((*pbVar5 & 0x7f) << (uVar7 & 0x1f)) + uVar6;
          if (-1 < (char)*pbVar5) {
            *puVar3 = uVar6;
            puVar3 = puVar3 + 1;
            break;
          }
          uVar7 = uVar7 + 7;
          inbyte = pbVar5 + 1;
        } while (pbVar5 + 1 < pbVar2);
        inbyte = pbVar5 + 1;
      } while (inbyte < pbVar2);
      inbyte = pbVar5 + 1;
    }
    sVar4 = (long)puVar3 - (long)out >> 2;
  }
  *nvalue = sVar4;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     uint32_t *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const uint32_t *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 5) {
      uint8_t c;
      uint32_t v;

      c = inbyte[0];
      v = c & 0x7F;
      if (c < 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c < 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c < 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c < 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      inbyte += 5;
      v |= (c & 0x0F) << 28;
      *out++ = v;
    }
    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (uint32_t v = 0; endbyte > inbyte; shift += 7) {
        uint8_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c < 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }